

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

int Abc_NtkCollectPiPos_int(Abc_Obj_t *pBox,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  undefined4 local_38;
  undefined4 local_34;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLoMaps_local;
  Vec_Ptr_t *vLiMaps_local;
  Abc_Ntk_t *pNtk_local;
  Abc_Obj_t *pBox_local;
  
  local_38 = 0;
  Abc_NtkIncrementTravId(pNtk);
  for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_34);
    pAVar2 = Abc_ObjFanout0(pAVar2);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pBox), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_ObjFanin(pBox,local_34);
      Vec_PtrPush(vLiMaps,pAVar2);
    }
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_34);
      Vec_PtrPush(vLoMaps,pAVar2);
    }
  }
  for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_34);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_NtkCollectPiPos_rec(pAVar2,vLiMaps,vLoMaps);
    local_38 = iVar1 + local_38;
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,local_34);
      Vec_PtrPush(vLiMaps,pAVar2);
    }
    for (local_34 = 0; iVar1 = Abc_ObjFanoutNum(pBox), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_ObjFanout(pBox,local_34);
      Vec_PtrPush(vLoMaps,pAVar2);
    }
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    Abc_Obj_t * pObj; 
    int i, Counter = 0;
    // mark primary inputs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
    // add primary inputs
    if ( pBox )
    {
        Abc_ObjForEachFanin( pBox, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_NtkForEachPi( pNtk, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
    }
    // visit primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pObj), vLiMaps, vLoMaps );
    // add primary outputs
    if ( pBox )
    {
        Abc_NtkForEachPo( pNtk, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_ObjForEachFanout( pBox, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
        Counter++;
    }
    return Counter;
}